

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

void slang::ast::Lookup::qualified
               (ScopedNameSyntax *syntax,ASTContext *context,bitmask<slang::ast::LookupFlags> flags,
               LookupResult *result)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  SourceRange range_02;
  string_view name_00;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_01;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_02;
  NameComponents name_01;
  NameComponents name_02;
  bool bVar1;
  bool bVar2;
  ASTContext *context_00;
  Scope *pSVar3;
  Symbol *pSVar4;
  RootSymbol *pRVar5;
  reference pNVar6;
  LookupResult *in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  LookupLocation LVar7;
  LookupResult originalResult;
  SymbolIndex in_stack_000003e8;
  LookupResult *in_stack_000003f0;
  Scope *in_stack_000003f8;
  SyntaxNode *in_stack_00000400;
  Symbol *symbol;
  LookupLocation location;
  Scope *current;
  Compilation *compilation;
  Scope *scope;
  anon_class_40_5_f337d8d5 popFront;
  string_view name;
  NameComponents first;
  SyntaxKind firstKind;
  NameSyntax *leftMost;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int colonParts;
  LookupResult *in_stack_fffffffffffff828;
  LookupResult *in_stack_fffffffffffff830;
  SourceLocation in_stack_fffffffffffff838;
  SourceLocation in_stack_fffffffffffff840;
  uint uVar8;
  LookupResult *in_stack_fffffffffffff848;
  SourceLocation in_stack_fffffffffffff850;
  SourceLocation in_stack_fffffffffffff858;
  undefined8 in_stack_fffffffffffff860;
  DiagCode code;
  LookupResult *in_stack_fffffffffffff868;
  undefined6 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff876;
  undefined1 in_stack_fffffffffffff877;
  LookupResult *in_stack_fffffffffffff878;
  undefined5 in_stack_fffffffffffff880;
  undefined1 in_stack_fffffffffffff885;
  undefined1 in_stack_fffffffffffff886;
  undefined1 in_stack_fffffffffffff887;
  SourceLocation in_stack_fffffffffffff888;
  SourceLocation in_stack_fffffffffffff890;
  undefined8 in_stack_fffffffffffff898;
  bitmask<slang::ast::LookupFlags> flags_00;
  NameSyntax *in_stack_fffffffffffff8a8;
  NameComponents *in_stack_fffffffffffff8b0;
  LookupResult *in_stack_fffffffffffff8d8;
  Scope *in_stack_fffffffffffff8e0;
  undefined8 in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f4;
  undefined8 in_stack_fffffffffffff8f8;
  bitmask<slang::ast::LookupFlags> flags_01;
  LookupResult *result_00;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  undefined8 in_stack_fffffffffffff948;
  bitmask<slang::ast::LookupFlags> flags_02;
  pointer in_stack_fffffffffffff950;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff958;
  bitmask<slang::ast::LookupResultFlags> local_67d [5];
  LookupResult *local_678;
  LookupResult *pLStack_670;
  SourceLocation local_668;
  SourceLocation SStack_660;
  pointer local_658;
  size_t sStack_650;
  ParameterValueAssignmentSyntax *local_648;
  undefined1 in_stack_fffffffffffffaa7;
  Scope *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffffab4;
  NameComponents *in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac4;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *in_stack_fffffffffffffac8;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  LookupResult *in_stack_fffffffffffffae8;
  SourceLocation in_stack_fffffffffffffc68;
  SourceLocation in_stack_fffffffffffffc70;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc88;
  LookupResult *local_2e0;
  LookupResult *pLStack_2d8;
  SourceLocation local_2d0;
  LookupLocation local_290;
  Scope *local_280;
  LookupResult *local_270;
  LookupResult *pLStack_268;
  SourceLocation in_stack_fffffffffffffda0;
  SourceLocation SVar9;
  Scope *in_stack_fffffffffffffda8;
  uint32_t in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  Scope *in_stack_fffffffffffffdb8;
  uint32_t in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  LookupResult *in_stack_fffffffffffffdc8;
  LookupResult *in_stack_fffffffffffffdd0;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  LookupResult *local_1b8;
  LookupResult *pLStack_1b0;
  SourceLocation local_1a8;
  SourceLocation SStack_1a0;
  pointer local_198;
  size_t sStack_190;
  ParameterValueAssignmentSyntax *local_188;
  SyntaxKind local_180;
  ASTContext *local_170;
  Scope *in_stack_ffffffffffffff18;
  bitmask<slang::ast::LookupFlags> in_stack_ffffffffffffff24;
  LookupLocation in_stack_ffffffffffffff28;
  string_view in_stack_ffffffffffffff38;
  
  flags_01.m_bits = (underlying_type)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
  code = SUB84((ulong)in_stack_fffffffffffff860 >> 0x20,0);
  flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffff898 >> 0x20);
  bVar2 = false;
  result_00 = (LookupResult *)&stack0xfffffffffffffe98;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>::SmallVector
            ((SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)0x8e1487);
  context_00 = (ASTContext *)
               anon_unknown_39::splitScopedName
                         ((ScopedNameSyntax *)in_stack_fffffffffffff890,
                          (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
                          in_stack_fffffffffffff888,
                          (int *)CONCAT17(in_stack_fffffffffffff887,
                                          CONCAT16(in_stack_fffffffffffff886,
                                                   CONCAT15(in_stack_fffffffffffff885,
                                                            in_stack_fffffffffffff880))));
  local_180 = (((ExpressionSyntax *)&context_00->scope)->super_SyntaxNode).kind;
  local_170 = context_00;
  anon_unknown_39::NameComponents::NameComponents
            (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  local_1c8._M_len = (size_t)local_1b8;
  local_1c8._M_str = (char *)pLStack_1b0;
  pSVar3 = not_null<const_slang::ast::Scope_*>::operator*
                     ((not_null<const_slang::ast::Scope_*> *)0x8e1553);
  ASTContext::getCompilation((ASTContext *)0x8e157a);
  if (local_180 == LocalScope) {
    if ((*(long *)(in_RSI + 0x28) == 0) || (**(long **)(in_RSI + 0x28) == 0)) {
      sourceRange.endLoc = in_stack_fffffffffffff858;
      sourceRange.startLoc = in_stack_fffffffffffff850;
      LookupResult::addDiag
                (in_stack_fffffffffffff848,(Scope *)in_stack_fffffffffffff840,code,sourceRange);
      goto LAB_008e220e;
    }
    qualified::anon_class_40_5_f337d8d5::operator()
              ((anon_class_40_5_f337d8d5 *)in_stack_fffffffffffff830);
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1c8);
  flags_02.m_bits = (underlying_type)((ulong)in_stack_fffffffffffff948 >> 0x20);
  if (bVar1) goto LAB_008e220e;
  if ((local_180 - ArrayAndMethod < 2) || (local_180 - ArrayUniqueMethod < 2)) {
LAB_008e1db4:
    sourceRange_00.endLoc = in_stack_fffffffffffff858;
    sourceRange_00.startLoc = in_stack_fffffffffffff850;
    LookupResult::addDiag
              (in_stack_fffffffffffff848,(Scope *)in_stack_fffffffffffff840,code,sourceRange_00);
    arg._M_str._0_5_ = in_stack_fffffffffffff880;
    arg._M_len = (size_t)in_stack_fffffffffffff878;
    arg._M_str._5_1_ = in_stack_fffffffffffff885;
    arg._M_str._6_1_ = in_stack_fffffffffffff886;
    arg._M_str._7_1_ = in_stack_fffffffffffff887;
    Diagnostic::operator<<
              ((Diagnostic *)
               CONCAT17(in_stack_fffffffffffff877,
                        CONCAT16(in_stack_fffffffffffff876,in_stack_fffffffffffff870)),arg);
    goto LAB_008e220e;
  }
  if (local_180 == ClassName) {
LAB_008e1725:
    in_stack_fffffffffffffdc8 = (LookupResult *)local_1c8._M_len;
    in_stack_fffffffffffffdd0 = (LookupResult *)local_1c8._M_str;
    LVar7 = ASTContext::getLocation((ASTContext *)in_stack_fffffffffffff830);
    uVar8 = in_stack_fffffffffffff840._4_4_;
    in_stack_fffffffffffffda8 = LVar7.scope;
    in_stack_fffffffffffffdb0 = LVar7.index;
    in_stack_fffffffffffffdb8 = in_stack_fffffffffffffda8;
    in_stack_fffffffffffffdc0 = in_stack_fffffffffffffdb0;
    std::optional<slang::SourceRange>::optional<slang::SourceRange_&,_true>
              ((optional<slang::SourceRange> *)in_stack_fffffffffffff830,
               (SourceRange *)in_stack_fffffffffffff828);
    in_stack_fffffffffffff840 = (SourceLocation)((ulong)uVar8 << 0x20);
    SVar9 = in_stack_fffffffffffffda0;
    unqualifiedImpl(in_stack_ffffffffffffff18,in_stack_ffffffffffffff38,in_stack_ffffffffffffff28,
                    (optional<slang::SourceRange>)
                    originalResult.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.stackBase.
                    _88_24_,in_stack_ffffffffffffff24,in_stack_000003e8,in_stack_000003f0,
                    in_stack_000003f8,in_stack_00000400);
    in_stack_fffffffffffff828 = local_270;
    in_stack_fffffffffffff830 = pLStack_268;
    in_stack_fffffffffffff838 = in_stack_fffffffffffffda0;
    in_stack_fffffffffffffda0 = SVar9;
  }
  else {
    if (local_180 == ConstructorName) goto LAB_008e1db4;
    if (local_180 - IdentifierName < 2) goto LAB_008e1725;
    if (local_180 == LocalScope) goto LAB_008e220e;
    if (local_180 == RootScope) {
      bVar2 = Scope::isUninstantiated((Scope *)in_stack_fffffffffffff868);
      if (!bVar2) {
        pRVar5 = Compilation::getRoot((Compilation *)0x8e1ad6);
        in_RCX->found = &pRVar5->super_Symbol;
        std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::
        span<slang::SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>_&>
                  ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                    *)in_stack_fffffffffffff840,
                   (SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)
                   in_stack_fffffffffffff838);
        nameParts_01._M_ptr._4_4_ = in_stack_fffffffffffffc84;
        nameParts_01._M_ptr._0_4_ = in_stack_fffffffffffffc80;
        nameParts_01._M_extent._M_extent_value = in_stack_fffffffffffffc88._M_extent_value;
        name_01.text._M_str = (char *)in_stack_fffffffffffffda8;
        name_01.text._M_len = (size_t)in_stack_fffffffffffffda0;
        name_01.range.startLoc._0_4_ = in_stack_fffffffffffffdb0;
        name_01.range.startLoc._4_4_ = in_stack_fffffffffffffdb4;
        name_01.range.endLoc = (SourceLocation)in_stack_fffffffffffffdb8;
        name_01.selectors._M_ptr._0_4_ = in_stack_fffffffffffffdc0;
        name_01.selectors._M_ptr._4_4_ = in_stack_fffffffffffffdc4;
        name_01.selectors._M_extent._M_extent_value = (size_t)in_stack_fffffffffffffdc8;
        name_01.paramAssignments = (ParameterValueAssignmentSyntax *)in_stack_fffffffffffffdd0;
        anon_unknown_39::lookupDownward
                  (nameParts_01,name_01,(ASTContext *)in_stack_fffffffffffffc70,
                   in_stack_fffffffffffffc7c,(LookupResult *)in_stack_fffffffffffffc68);
      }
      goto LAB_008e220e;
    }
    if (local_180 == SuperHandle) {
      range_01.endLoc._0_4_ = in_stack_fffffffffffff8f0;
      range_01.startLoc = (SourceLocation)in_stack_fffffffffffff8e8;
      range_01.endLoc._4_4_ = in_stack_fffffffffffff8f4;
      pSVar4 = anon_unknown_39::findSuperHandle
                         (in_stack_fffffffffffff8e0,flags_01,range_01,in_stack_fffffffffffff8d8);
      in_RCX->found = pSVar4;
      bVar2 = true;
    }
    else if (local_180 == ThisHandle) {
      range.endLoc = in_stack_fffffffffffff890;
      range.startLoc = in_stack_fffffffffffff888;
      in_stack_fffffffffffffc88._M_extent_value = (size_t)local_1a8;
      pSVar4 = anon_unknown_39::findThisHandle
                         ((Scope *)CONCAT17(in_stack_fffffffffffff887,
                                            CONCAT16(in_stack_fffffffffffff886,
                                                     CONCAT15(in_stack_fffffffffffff885,
                                                              in_stack_fffffffffffff880))),flags_00,
                          range,in_stack_fffffffffffff878);
      in_RCX->found = pSVar4;
      if ((in_RCX->found != (Symbol *)0x0) &&
         (pNVar6 = SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::back
                             ((SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
                              &stack0xfffffffffffffe98), pNVar6->kind == SuperHandle)) {
        pNVar6 = SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::back
                           ((SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
                            &stack0xfffffffffffffe98);
        local_188 = (pNVar6->name).paramAssignments;
        local_1b8 = (LookupResult *)(pNVar6->name).text._M_len;
        pLStack_1b0 = (LookupResult *)(pNVar6->name).text._M_str;
        local_1a8 = (pNVar6->name).range.startLoc;
        SStack_1a0 = (pNVar6->name).range.endLoc;
        local_198 = (pNVar6->name).selectors._M_ptr;
        sStack_190 = (pNVar6->name).selectors._M_extent._M_extent_value;
        SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::pop_back
                  ((SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
                   in_stack_fffffffffffff830);
        range_00.endLoc._0_4_ = in_stack_fffffffffffff8f0;
        range_00.startLoc = (SourceLocation)in_stack_fffffffffffff8e8;
        range_00.endLoc._4_4_ = in_stack_fffffffffffff8f4;
        in_stack_fffffffffffffc68 = local_1a8;
        in_stack_fffffffffffffc70 = SStack_1a0;
        pSVar4 = anon_unknown_39::findSuperHandle
                           (in_stack_fffffffffffff8e0,flags_01,range_00,in_stack_fffffffffffff8d8);
        in_RCX->found = pSVar4;
        bVar2 = true;
        in_stack_fffffffffffffc84 = in_EDX;
      }
    }
    else {
      qualified::anon_class_40_5_f337d8d5::operator()
                ((anon_class_40_5_f337d8d5 *)in_stack_fffffffffffff830);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1c8);
      if (bVar1) goto LAB_008e220e;
      local_280 = pSVar3;
      LVar7 = ASTContext::getLocation((ASTContext *)in_stack_fffffffffffff830);
      local_290.scope = LVar7.scope;
      local_290.index = LVar7.index;
      do {
        pSVar4 = Scope::asSymbol(local_280);
        flags_02.m_bits = (underlying_type)((ulong)in_stack_fffffffffffff948 >> 0x20);
        if (pSVar4->kind == CompilationUnit) {
          std::optional<slang::SourceRange>::optional<slang::SourceRange_&,_true>
                    ((optional<slang::SourceRange> *)in_stack_fffffffffffff830,
                     (SourceRange *)in_stack_fffffffffffff828);
          in_stack_fffffffffffff840 =
               (SourceLocation)((ulong)in_stack_fffffffffffff840 & 0xffffffff00000000);
          unqualifiedImpl(in_stack_ffffffffffffff18,in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff28,
                          (optional<slang::SourceRange>)
                          originalResult.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                          stackBase._88_24_,in_stack_ffffffffffffff24,in_stack_000003e8,
                          in_stack_000003f0,in_stack_000003f8,in_stack_00000400);
          in_stack_fffffffffffff828 = local_2e0;
          in_stack_fffffffffffff830 = pLStack_2d8;
          in_stack_fffffffffffff838 = local_2d0;
          break;
        }
        LVar7 = LookupLocation::after((Symbol *)in_stack_fffffffffffff830);
        local_290.scope = LVar7.scope;
        local_290.index = LVar7.index;
        local_280 = LookupLocation::getScope(&local_290);
        flags_02.m_bits = (underlying_type)((ulong)in_stack_fffffffffffff948 >> 0x20);
      } while (local_280 != (Scope *)0x0);
    }
  }
  bVar1 = LookupResult::hasError(in_stack_fffffffffffff868);
  if (bVar1) goto LAB_008e220e;
  if (bVar2) {
    anon_unknown_39::resolveColonNames
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac4,in_stack_fffffffffffffab8,
               in_stack_fffffffffffffad0,
               (LookupResult *)CONCAT44(in_stack_fffffffffffffab4.m_bits,in_stack_fffffffffffffab0),
               (ASTContext *)in_stack_fffffffffffffaa8);
    goto LAB_008e220e;
  }
  LookupResult::LookupResult(in_stack_fffffffffffff830);
  if (in_RCX->found == (Symbol *)0x0) {
LAB_008e206e:
    std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::
    span<slang::SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>_&>
              ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> *
               )in_stack_fffffffffffff840,
               (SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)
               in_stack_fffffffffffff838);
    nameParts_00._M_extent._M_extent_value = in_stack_fffffffffffff958._M_extent_value;
    nameParts_00._M_ptr = in_stack_fffffffffffff950;
    bVar2 = anon_unknown_39::lookupUpward
                      (nameParts_00,
                       (NameComponents *)
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940.m_bits),
                       context_00,flags_02,result_00);
    if ((((bVar2) && (in_RCX->found == (Symbol *)0x0)) &&
        (LookupResult::operator=(in_stack_fffffffffffff830,in_stack_fffffffffffff828),
        in_RCX->found == (Symbol *)0x0)) &&
       (bVar2 = LookupResult::hasError(in_stack_fffffffffffff868), !bVar2)) {
      bitmask<slang::ast::LookupFlags>::bitmask
                ((bitmask<slang::ast::LookupFlags> *)&stack0xfffffffffffff940,
                 NoUndeclaredErrorIfUninstantiated);
      bitmask<slang::ast::LookupFlags>::operator|
                ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffff838,
                 (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffff830);
      name_00._M_str._0_4_ = in_stack_fffffffffffffad0.m_bits;
      name_00._M_len = (size_t)in_stack_fffffffffffffac8;
      name_00._M_str._4_4_ = in_stack_fffffffffffffad4;
      range_02.endLoc._0_4_ = in_stack_fffffffffffffac0;
      range_02.startLoc = (SourceLocation)in_stack_fffffffffffffab8;
      range_02.endLoc._4_4_ = in_stack_fffffffffffffac4;
      reportUndeclared(in_stack_fffffffffffffaa8,name_00,range_02,in_stack_fffffffffffffab4,
                       (bool)in_stack_fffffffffffffaa7,in_stack_fffffffffffffae8);
      in_stack_fffffffffffff830 = in_RCX;
    }
  }
  else {
    std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::
    span<slang::SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>_&>
              ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> *
               )in_stack_fffffffffffff840,
               (SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)
               in_stack_fffffffffffff838);
    local_648 = local_188;
    local_658 = local_198;
    sStack_650 = sStack_190;
    local_668 = local_1a8;
    SStack_660 = SStack_1a0;
    local_678 = local_1b8;
    pLStack_670 = pLStack_1b0;
    nameParts_02._M_ptr._4_4_ = in_stack_fffffffffffffc84;
    nameParts_02._M_ptr._0_4_ = in_stack_fffffffffffffc80;
    nameParts_02._M_extent._M_extent_value = in_stack_fffffffffffffc88._M_extent_value;
    name_02.text._M_str = (char *)in_stack_fffffffffffffda8;
    name_02.text._M_len = (size_t)in_stack_fffffffffffffda0;
    name_02.range.startLoc._0_4_ = in_stack_fffffffffffffdb0;
    name_02.range.startLoc._4_4_ = in_stack_fffffffffffffdb4;
    name_02.range.endLoc = (SourceLocation)in_stack_fffffffffffffdb8;
    name_02.selectors._M_ptr._0_4_ = in_stack_fffffffffffffdc0;
    name_02.selectors._M_ptr._4_4_ = in_stack_fffffffffffffdc4;
    name_02.selectors._M_extent._M_extent_value = (size_t)in_stack_fffffffffffffdc8;
    name_02.paramAssignments = (ParameterValueAssignmentSyntax *)in_stack_fffffffffffffdd0;
    in_stack_fffffffffffff828 = local_1b8;
    in_stack_fffffffffffff830 = pLStack_1b0;
    in_stack_fffffffffffff838 = local_1a8;
    in_stack_fffffffffffff840 = SStack_1a0;
    bVar2 = anon_unknown_39::lookupDownward
                      (nameParts_02,name_02,(ASTContext *)in_stack_fffffffffffffc70,
                       in_stack_fffffffffffffc7c,(LookupResult *)in_stack_fffffffffffffc68);
    if (bVar2) {
      bVar2 = true;
      if (in_RCX->found == (Symbol *)0x0) {
        bitmask<slang::ast::LookupResultFlags>::bitmask(local_67d,WasImported);
        bVar2 = bitmask<slang::ast::LookupResultFlags>::has
                          ((bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffff830,
                           (bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffff828);
      }
      if (bVar2 == false) {
        LookupResult::operator=(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
        goto LAB_008e206e;
      }
    }
  }
  LookupResult::~LookupResult(in_stack_fffffffffffff830);
LAB_008e220e:
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>::~SmallVector
            ((SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)0x8e221b);
  return;
}

Assistant:

void Lookup::qualified(const ScopedNameSyntax& syntax, const ASTContext& context,
                       bitmask<LookupFlags> flags, LookupResult& result) {
    // Split the name into easier to manage chunks. The parser will always produce a
    // left-recursive name tree, so that's all we'll bother to handle.
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    auto leftMost = splitScopedName(syntax, nameParts, colonParts);

    SyntaxKind firstKind = leftMost->kind;
    NameComponents first = *leftMost;
    auto name = first.text;

    auto popFront = [&] {
        first = nameParts.back().name;
        firstKind = nameParts.back().kind;
        nameParts.pop_back();
        name = first.text;
        if (colonParts)
            colonParts--;
    };

    auto& scope = *context.scope;
    auto& compilation = context.getCompilation();

    if (firstKind == SyntaxKind::LocalScope) {
        if (!context.randomizeDetails || !context.randomizeDetails->classType) {
            result.addDiag(scope, diag::LocalNotAllowed, first.range);
            return;
        }

        // The local:: is allowed here. Pop it and look up the rest of
        // the name as if the local hadn't been specified -- the local
        // lookup portion has already been ensured because we exited
        // early from withinClassRandomize.
        popFront();
    }

    if (name.empty())
        return;

    switch (firstKind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            // Start by trying to find the first name segment using normal unqualified lookup
            unqualifiedImpl(scope, name, context.getLocation(), first.range, flags, {}, result,
                            scope, nullptr);
            break;
        case SyntaxKind::UnitScope: {
            // Walk upward to find the compilation unit scope.
            popFront();
            if (name.empty())
                return;

            const Scope* current = &scope;
            LookupLocation location = context.getLocation();
            do {
                auto& symbol = current->asSymbol();
                if (symbol.kind == SymbolKind::CompilationUnit) {
                    unqualifiedImpl(*current, name, location, first.range, flags, {}, result, scope,
                                    nullptr);
                    break;
                }

                location = LookupLocation::after(symbol);
                current = location.getScope();
            } while (current);

            break;
        }
        case SyntaxKind::RootScope:
            // Ignore hierarchical lookups that occur inside uninstantiated modules.
            if (scope.isUninstantiated())
                return;

            result.found = &compilation.getRoot();
            lookupDownward(nameParts, first, context, flags, result);
            return;
        case SyntaxKind::ThisHandle:
            result.found = findThisHandle(scope, flags, first.range, result);
            if (result.found && nameParts.back().kind == SyntaxKind::SuperHandle) {
                // Handle "this.super.whatever" the same as if the user had just
                // written "super.whatever".
                first = nameParts.back().name;
                nameParts.pop_back();
                result.found = findSuperHandle(scope, flags, first.range, result);
                colonParts = 1;
            }
            break;
        case SyntaxKind::SuperHandle:
            result.found = findSuperHandle(scope, flags, first.range, result);
            colonParts = 1; // pretend we used colon access to resolve class scoped name
            break;
        case SyntaxKind::LocalScope:
            // This is only reachable in invalid code. An error has already been
            // reported so early out.
            return;
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayXorMethod:
        case SyntaxKind::ConstructorName:
            result.addDiag(scope, diag::UnexpectedNameToken, first.range) << name;
            return;
        default:
            SLANG_UNREACHABLE;
    }

    if (result.hasError())
        return;

    // [23.7.1] If we are starting with a colon separator, always do a downwards name
    // resolution.
    if (colonParts) {
        resolveColonNames(nameParts, colonParts, first, flags, result, context);
        return;
    }

    // [23.7] lists the possible cases for dotted names:
    // 1. The name resolves to a value symbol. The dotted name is a member select.
    // 2. The name resolves to a local scope. The dotted name is a hierarchical reference.
    // 3. The name resolves to an imported scope. The dotted name is a hierarchical reference,
    //    but with an added restriction that only a direct downward lookup from the package is
    //    allowed.
    // 4. The name is not found; it's considered a hierarchical reference and participates in
    //    upwards name resolution.

    LookupResult originalResult;
    if (result.found) {
        // Perform the downward lookup.
        if (!lookupDownward(nameParts, first, context, flags, result))
            return;

        // If we found a symbol, we're done with lookup. In case (1) above we'll always have a
        // found symbol here. Otherwise, if we're in case (2) we need to do further upwards name
        // lookup. If we're in case (3) we've already issued an error and just need to give up.
        if (result.found || result.flags.has(LookupResultFlags::WasImported))
            return;

        originalResult = result;
    }

    // If we reach this point we're in case (2) or (4) above. Go up through the instantiation
    // hierarchy and see if we can find a match there.
    if (!lookupUpward(nameParts, first, context, flags, result))
        return;

    if (result.found)
        return;

    // We couldn't find anything. originalResult has any diagnostics issued by the first
    // downward lookup (if any), so it's fine to just return it as is. If we never found any
    // symbol originally, issue an appropriate error for that.
    result = originalResult;
    if (!result.found && !result.hasError()) {
        reportUndeclared(scope, name, first.range,
                         flags | LookupFlags::NoUndeclaredErrorIfUninstantiated, true, result);
    }
}